

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histo.c
# Opt level: O3

int fits_make_histde(fitsfile *fptr,fitsfile *histptr,int *datatypes,int bitpix,int naxis,
                    long *naxes,int *colnum,char **colexpr,double *amin,double *amax,double *binsize
                    ,double weight,int wtcolnum,char *wtexpr,int recip,char *selectrow,int *status)

{
  int iVar1;
  iteratorCol *ptr;
  int iVar2;
  long lVar3;
  long lVar4;
  char *pcVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  int local_aec;
  long wtrepeat;
  fitsfile *local_ad8;
  int datatype;
  long local_ac8;
  long colrepeat;
  double local_ab8;
  long nelem;
  long nrows;
  int local_a9c;
  long *local_a98;
  double double_nulval;
  ulong local_a88;
  int *local_a80;
  double local_a78;
  int naxis1;
  int datatype_1;
  double tmin [4];
  double maxbin [4];
  double tbin [4];
  double taxes [4];
  histType histData;
  iteratorCol imagepars [1];
  ParseData parsers [5];
  parseInfo infos [5];
  
  nrows = -1;
  double_nulval = -9.1191291391491e-36;
  wtrepeat = 0;
  if (0 < *status) {
    return *status;
  }
  local_a80 = datatypes;
  memset(infos,0,0x2d0);
  memset(parsers,0,0x488);
  memset(&histData,0,0x130);
  if (4 < naxis) {
    ffpmsg("histogram has more than 4 dimensions");
    *status = 0x140;
    return 0x140;
  }
  if (bitpix < 8) {
    if (bitpix == -0x40) {
      iVar2 = 0x52;
    }
    else {
      if (bitpix != -0x20) {
LAB_001869b1:
        *status = 0x19a;
        return 0x19a;
      }
      iVar2 = 0x2a;
    }
  }
  else if (bitpix == 8) {
    iVar2 = 0xb;
  }
  else if (bitpix == 0x20) {
    iVar2 = 0x1f;
  }
  else {
    if (bitpix != 0x10) goto LAB_001869b1;
    iVar2 = 0x15;
  }
  local_ad8 = histptr;
  if (fptr->HDUposition != fptr->Fptr->curhdu) {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
  }
  if (wtcolnum < 1) {
    if ((((wtexpr != (char *)0x0) && (weight == 0.0)) && (!NAN(weight))) && (*wtexpr != '\0'))
    goto LAB_001869a7;
  }
  else if ((weight == 0.0) && (!NAN(weight))) {
LAB_001869a7:
    weight = -9.1191291391491e-36;
  }
  histData.wtcolnum = wtcolnum;
  histData.wtexpr = wtexpr;
  histData.wtrecip = recip;
  histData.rowselector = selectrow;
  histData.tblptr = fptr;
  histData.haxis = naxis;
  histData.himagetype = iVar2;
  histData.weight = weight;
  ptr = (iteratorCol *)fits_recalloc((void *)0x0,0,5,0x110);
  if (ptr == (iteratorCol *)0x0) {
    ffpmsg("memory allocation failure (fits_make_histde)");
    *status = 0x71;
    goto LAB_001872a6;
  }
  histData.startCols[0] = -1;
  histData.startCols[1] = -1;
  histData.startCols[2] = -1;
  histData.startCols[3] = -1;
  histData.startCols[4] = -1;
  local_a9c = iVar2;
  if (naxis < 1) {
    local_aec = 5;
    lVar3 = 0;
    iVar2 = 0;
  }
  else {
    local_a88 = (ulong)(uint)naxis;
    local_aec = 5;
    uVar6 = 0;
    lVar3 = 0;
    iVar2 = 0;
    local_a98 = naxes;
    do {
      colrepeat = 0;
      histData.startCols[uVar6] = iVar2;
      local_a78 = (double)local_a98[uVar6];
      taxes[uVar6] = local_a78;
      dVar7 = amin[uVar6];
      tmin[uVar6] = dVar7;
      dVar8 = amax[uVar6];
      if (((dVar8 < dVar7) && (dVar9 = binsize[uVar6], 0.0 < dVar9)) ||
         ((dVar9 = binsize[uVar6], dVar7 < dVar8 && (dVar9 < 0.0)))) {
        dVar9 = -dVar9;
      }
      tbin[uVar6] = dVar9;
      local_ac8 = lVar3;
      if (((colexpr == (char **)0x0) || (colexpr[uVar6] == (char *)0x0)) ||
         (*colexpr[uVar6] == '\0')) {
        local_ab8 = dVar8;
        ffeqty(fptr,colnum[uVar6],&datatype,&colrepeat,(long *)0x0,status);
        dVar8 = local_ab8;
      }
      if ((local_a80 != (int *)0x0) && (local_a80[uVar6] != 0)) {
        datatype = local_a80[uVar6];
      }
      if ((((0x29 < datatype) || (dVar7 != (double)(long)dVar7)) ||
          ((NAN(dVar7) || NAN((double)(long)dVar7) ||
           (((dVar8 != (double)(long)dVar8 || (NAN(dVar8) || NAN((double)(long)dVar8))) ||
            (dVar9 != (double)(long)dVar9)))))) || (NAN(dVar9) || NAN((double)(long)dVar9))) {
        maxbin[uVar6] = (dVar8 - dVar7) / dVar9;
      }
      else {
        maxbin[uVar6] = local_a78 + 1.0;
        if (dVar8 <= dVar7) {
          dVar7 = dVar7 + 0.5;
        }
        else {
          dVar7 = dVar7 + -0.5;
        }
        tmin[uVar6] = dVar7;
      }
      if (((colexpr == (char **)0x0) || (pcVar5 = colexpr[uVar6], pcVar5 == (char *)0x0)) ||
         (*pcVar5 == '\0')) {
        fits_iter_set_by_num(ptr + iVar2,fptr,colnum[uVar6],0x52,0);
        iVar2 = iVar2 + 1;
      }
      else {
        ffiprs(fptr,0,pcVar5,5,&datatype_1,&nelem,&naxis1,(long *)imagepars,parsers + uVar6,status);
        if (*status != 0) goto LAB_00187299;
        if (nelem < 0) {
          nelem = 1;
        }
        colrepeat = nelem;
        ffgnrw(fptr,&nrows,status);
        iVar1 = fits_parser_set_temporary_col
                          (parsers + uVar6,infos + uVar6,nrows,&double_nulval,status);
        if (iVar1 != 0) goto LAB_00187299;
        ptr = (iteratorCol *)
              fits_recalloc(ptr,(long)local_aec,(long)parsers[uVar6].nCols + (long)local_aec,0x110);
        if (ptr == (iteratorCol *)0x0) goto LAB_0018728f;
        iVar1 = parsers[uVar6].nCols;
        if (0 < iVar1) {
          local_ab8 = (double)CONCAT44(local_ab8._4_4_,iVar1);
          lVar3 = 0;
          lVar4 = 0;
          do {
            memcpy(ptr[iVar2].colname + lVar3 + -0xc,
                   (parsers[uVar6].colData)->colname + lVar3 + -0xc,0x110);
            lVar4 = lVar4 + 1;
            lVar3 = lVar3 + 0x110;
          } while (lVar4 < parsers[uVar6].nCols);
          iVar2 = iVar2 + (int)lVar4;
          iVar1 = local_ab8._0_4_;
        }
        local_aec = local_aec + iVar1;
      }
      lVar3 = colrepeat;
      if ((local_ac8 != 0) && (lVar3 = local_ac8, local_ac8 != colrepeat)) {
        pcVar5 = "vector dimensions of binning values do not agree";
        goto LAB_00187051;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != local_a88);
  }
  if ((((wtexpr == (char *)0x0) || (weight != -9.1191291391491e-36)) || (NAN(weight))) ||
     (*wtexpr == '\0')) {
    lVar4 = lVar3;
    if ((weight == -9.1191291391491e-36) && (!NAN(weight))) {
      ffeqty(fptr,wtcolnum,(int *)imagepars,&wtrepeat,(long *)0x0,status);
      histData.startCols[4] = iVar2;
      fits_iter_set_by_num(ptr + iVar2,fptr,wtcolnum,0x52,0);
      iVar2 = iVar2 + 1;
      lVar4 = wtrepeat;
    }
LAB_00187036:
    wtrepeat = lVar4;
    if (((wtrepeat == 0) || (lVar3 == 0)) || (wtrepeat == lVar3)) {
      histData.parsers = parsers;
      histData.infos = infos;
      histData.hcolnum[0] = *colnum;
      histData.amin1 = tmin[0];
      histData.maxbin1 = maxbin[0];
      histData.binsize1 = tbin[0];
      histData.haxis1 = (long)taxes[0];
      histData.incr[0] = 1;
      if (1 < histData.haxis) {
        histData.hcolnum[1] = colnum[1];
        histData.amin2 = tmin[1];
        histData.maxbin2 = maxbin[1];
        histData.haxis2 = (long)taxes[1];
        histData.binsize2 = tbin[1];
        histData.incr[1] = histData.haxis1;
        if (histData.haxis != 2) {
          histData.hcolnum[2] = colnum[2];
          histData.amin3 = tmin[2];
          histData.maxbin3 = maxbin[2];
          histData.binsize3 = tbin[2];
          histData.haxis3 = (long)taxes[2];
          histData.incr[2] = histData.haxis2 * histData.haxis1;
          if (3 < (uint)histData.haxis) {
            histData.hcolnum[3] = colnum[3];
            histData.amin4 = tmin[3];
            histData.maxbin4 = maxbin[3];
            histData.haxis4 = (long)taxes[3];
            histData.binsize4 = tbin[3];
            histData.incr[3] = histData.incr[2] * histData.haxis3;
          }
        }
      }
      histData.repeat = lVar3;
      histData.numIterCols = iVar2;
      histData.iterCols = ptr;
      fits_iter_set_file(imagepars,local_ad8);
      fits_iter_set_datatype(imagepars,local_a9c);
      fits_iter_set_iotype(imagepars,2);
      ffiter(1,imagepars,0,-1,ffwritehisto,&histData,status);
    }
    else {
      pcVar5 = "vector dimensions of weights do not agree with bins";
LAB_00187051:
      ffpmsg(pcVar5);
      *status = 0x140;
    }
  }
  else {
    local_ac8 = lVar3;
    histData.startCols[4] = iVar2;
    ffiprs(fptr,0,wtexpr,5,(int *)&colrepeat,&wtrepeat,(int *)&nelem,(long *)imagepars,parsers + 4,
           status);
    if (*status == 0) {
      if (wtrepeat < 0) {
        wtrepeat = 1;
      }
      ffgnrw(fptr,&nrows,status);
      iVar1 = fits_parser_set_temporary_col(parsers + 4,infos + 4,nrows,&double_nulval,status);
      if (iVar1 == 0) {
        ptr = (iteratorCol *)
              fits_recalloc(ptr,(long)local_aec,(long)parsers[4].nCols + (long)local_aec,0x110);
        if (ptr != (iteratorCol *)0x0) {
          lVar3 = local_ac8;
          lVar4 = wtrepeat;
          if (0 < parsers[4].nCols) {
            lVar4 = 0;
            lVar3 = 0;
            do {
              memcpy(ptr[iVar2].colname + lVar4 + -0xc,(parsers[4].colData)->colname + lVar4 + -0xc,
                     0x110);
              lVar3 = lVar3 + 1;
              lVar4 = lVar4 + 0x110;
            } while (lVar3 < parsers[4].nCols);
            iVar2 = iVar2 + (int)lVar3;
            lVar3 = local_ac8;
            lVar4 = wtrepeat;
          }
          goto LAB_00187036;
        }
LAB_0018728f:
        *status = 0x71;
        ptr = (iteratorCol *)0x0;
      }
    }
  }
LAB_00187299:
  if (ptr != (iteratorCol *)0x0) {
    free(ptr);
  }
LAB_001872a6:
  lVar3 = 0;
  do {
    if (0 < *(int *)((long)parsers[0].nAxes + lVar3 + -0x18)) {
      ffcprs((ParseData *)((long)parsers[0].nAxes + lVar3 + -0x78));
    }
    lVar3 = lVar3 + 0xe8;
  } while (lVar3 != 0x488);
  return *status;
}

Assistant:

int fits_make_histde(fitsfile *fptr, /* IO - pointer to table with X and Y cols; */
    fitsfile *histptr, /* I - pointer to output FITS image      */
    int *datatypes,   /*  I - datatype of input (or 0 for auto) */
    int bitpix,       /* I - datatype for image: 16, 32, -32, etc    */
    int naxis,        /* I - number of axes in the histogram image   */
    long *naxes,      /* I - size of axes in the histogram image   */
    int *colnum,      /* I - column numbers (array length = naxis)   */
    char *colexpr[4], /* I - optional expression instead of column */
    double *amin,     /* I - minimum histogram value, for each axis */
    double *amax,     /* I - maximum histogram value, for each axis */
    double *binsize,  /* I - bin size along each axis               */
    double weight,    /* I - binning weighting factor (0 or DOUBLENULLVALUE means null) */
    int wtcolnum,     /* I - optional keyword or col for weight*/
    char *wtexpr,     /* I - optional weighting expression */
		      /*  disambiguation of weight values */
		      /*    non-null weight: use that value */
		      /*    null weight: use wtexpr if non-null, else wtcolnum */
    int recip,              /* I - use reciprocal of the weight?     */
    char *selectrow,        /* I - optional array (length = no. of   */
                             /* rows in the table).  If the element is true */
                             /* then the corresponding row of the table will*/
                             /* be included in the histogram, otherwise the */
                             /* row will be skipped.  Ingnored if *selectrow*/
                             /* is equal to NULL.                           */
    int *status)
{		  
    int ii, imagetype;
    int n_cols = 1;
    long imin, imax, ibin;
    long  offset = 0;
    long n_per_loop = -1;  /* force whole array to be passed at one time */
    double taxes[4], tmin[4], tmax[4], tbin[4], maxbin[4];
    histType histData;    /* Structure holding histogram info for iterator */
    iteratorCol imagepars[1];
    long nrows = -1;
    ParseData parsers[5];
    parseInfo infos[5];
    int numAllocCols = 0, startCol = -1, numIterCols = 0;
    iteratorCol *iterCols = 0;
    double double_nulval = DOUBLENULLVALUE;
    long repeat = 0, wtrepeat = 0;

    /* check inputs */
    
    if (*status > 0)
        return(*status);

    /* Make sure the parser information is initialized because we will
       use this to determine what needs to be deallocated at the end */
    memset(infos, 0, sizeof(infos));
    memset(parsers, 0, sizeof(parsers));
    memset(&histData, 0, sizeof(histData));

    if (naxis > 4)
    {
        ffpmsg("histogram has more than 4 dimensions");
        return(*status = BAD_DIMEN);
    }

    if   (bitpix == BYTE_IMG)
         imagetype = TBYTE;
    else if (bitpix == SHORT_IMG)
         imagetype = TSHORT;
    else if (bitpix == LONG_IMG)
         imagetype = TINT;    
    else if (bitpix == FLOAT_IMG)
         imagetype = TFLOAT;    
    else if (bitpix == DOUBLE_IMG)
         imagetype = TDOUBLE;    
    else
        return(*status = BAD_DATATYPE);

    /* reset position to the correct HDU if necessary */
    if ((fptr)->HDUposition != ((fptr)->Fptr)->curhdu)
        ffmahd(fptr, ((fptr)->HDUposition) + 1, NULL, status);

    /* Resolve the conflict between wtexpr, wtcolnum, and weight */
    if ( ((wtcolnum > 0) || (wtexpr && wtexpr[0])) && weight == 0 ) weight = DOUBLENULLVALUE;
    histData.weight     = weight;
    histData.wtcolnum   = wtcolnum;
    histData.wtexpr     = wtexpr;
    histData.wtrecip    = recip;
    histData.tblptr     = fptr;
    histData.himagetype = imagetype;
    histData.haxis      = naxis;
    histData.rowselector = selectrow;

    /* Now make iterator columns for input, as well as any calculated values */
    numAllocCols = 5;
    iterCols = fits_recalloc(0, 0, numAllocCols, sizeof(iteratorCol));
    if (!iterCols) {
      ffpmsg("memory allocation failure (fits_make_histde)");
      *status = MEMORY_ALLOCATION;
      goto cleanup;
    }

    /* We fill the iterCols in order, starting from column 1 through 4, and 
       then moving on to the weighting column */
    for (ii = 0; ii < 5; ii++)  histData.startCols[ii] = -1;
    startCol = 0;

    /* Loop through each axis and recheck the binning parameters */
    for (ii = 0; ii < naxis; ii++)
    {
      long colrepeat = 0;
      int datatype;
      histData.startCols[ii] = startCol;

      taxes[ii] = (double) naxes[ii];
      tmin[ii] = amin[ii];
      tmax[ii] = amax[ii];
      if ( (amin[ii] > amax[ii] && binsize[ii] > 0. ) ||
           (amin[ii] < amax[ii] && binsize[ii] < 0. ) )
          tbin[ii] =  -binsize[ii];  /* reverse the sign of binsize */
      else
          tbin[ii] =   binsize[ii];  /* binsize has the correct sign */
          
      imin = (long) tmin[ii];
      imax = (long) tmax[ii];
      ibin = (long) tbin[ii];
    
      /* get the datatype of the column and repeat */
      if (! (colexpr && colexpr[ii] && colexpr[ii][0]) ) {
	fits_get_eqcoltype(fptr, colnum[ii], &datatype, &colrepeat, NULL, status);
      }

      /* If caller specified datatype, use that */
      if (datatypes && datatypes[ii]) {
	datatype = datatypes[ii];
      }

      if (datatype <= TLONG && (double) imin == tmin[ii] &&
                               (double) imax == tmax[ii] &&
                               (double) ibin == tbin[ii] )
      {
        /* This is an integer column and integer limits were entered. */
        /* Shift the lower and upper histogramming limits by 0.5, so that */
        /* the values fall in the center of the bin, not on the edge. */

        maxbin[ii] = (taxes[ii] + 1.F);  /* add 1. instead of .5 to avoid roundoff */

        if (tmin[ii] < tmax[ii])
        {
          tmin[ii] = tmin[ii] - 0.5F;
          tmax[ii] = tmax[ii] + 0.5F;
        }
        else
        {
          tmin[ii] = tmin[ii] + 0.5F;
          tmax[ii] = tmax[ii] - 0.5F;
        }
      } else {  /* not an integer column with integer limits */
          maxbin[ii] = (tmax[ii] - tmin[ii]) / tbin[ii]; 
      }

      /* This is a column expression.  Here is where we allocate the 
	 parser for it during the actual evaluation. */
      if (colexpr && colexpr[ii] && colexpr[ii][0]) {
	int datatype, naxis1;
	long nelem, naxes[MAXDIMS];
	int jj;

	/* Initialize the parser for this binning expression */
	ffiprs( fptr, 0, colexpr[ii], MAXDIMS, &datatype, &nelem, &naxis1,
		naxes, &(parsers[ii]), status );
	if (*status) goto cleanup;
	if (nelem < 0) nelem = 1; /* If it's a constant expression */

	colrepeat = nelem;

	/* Set up the parser data for evaluation to a TemporaryCol */
	fits_get_num_rows(fptr, &nrows, status);
	if (fits_parser_set_temporary_col(&(parsers[ii]), &(infos[ii]), nrows,
					  (void *) &(double_nulval), status)) goto cleanup;

	/* Copy iterator columns from the parser to the master iterator columns */
	iterCols = fits_recalloc(iterCols, numAllocCols, numAllocCols+parsers[ii].nCols,
			    sizeof(iteratorCol));
	if (!iterCols) {
	  *status = MEMORY_ALLOCATION;
	  goto cleanup;
	}
	numAllocCols += parsers[ii].nCols;
	for (jj = 0; jj < parsers[ii].nCols; jj++) iterCols[startCol++] = parsers[ii].colData[jj];

      } else {

	/* Just a "regular" column name, we already have enough allocated for these */
	fits_iter_set_by_num(&(iterCols[startCol]), fptr, colnum[ii], TDOUBLE, InputCol);
	startCol ++;
      }

      /* Check that all the vector dimensions agree */
      if (repeat == 0) {
	repeat = colrepeat;
      } else {
	if (repeat != colrepeat) {
	  ffpmsg("vector dimensions of binning values do not agree");
	  *status = BAD_DIMEN;
	  goto cleanup;
	}
      }

    } /* End of loop over columns */

    /* Now initialize the iterator column data for the weighting */
    if (wtexpr && wtexpr[0] && weight == DOUBLENULLVALUE) {
      int wtdatatype, wtnaxis;
      long wtnaxes[MAXDIMS];
      int jj;

      histData.startCols[4] = startCol;
      ffiprs( fptr, 0, wtexpr, MAXDIMS, &wtdatatype, &wtrepeat, &wtnaxis,
	      wtnaxes, &(parsers[4]), status );
      if (*status) goto cleanup;
      if (wtrepeat < 0) wtrepeat = 1; /* If it's a constant expression */

      /* Set up the parser data for evaluation to a TemporaryCol */
      /* It's a weighting expression, set that up and ... */
      fits_get_num_rows(fptr, &nrows, status);
      if (fits_parser_set_temporary_col(&(parsers[4]), &(infos[4]), nrows,
					(void *) &(double_nulval), status)) goto cleanup;

      /* Copy iterator columns from the parser to the master iterator columns */
      iterCols = fits_recalloc(iterCols, numAllocCols, numAllocCols+parsers[4].nCols,
			  sizeof(iteratorCol));
      if (!iterCols) {
	*status = MEMORY_ALLOCATION;
	goto cleanup;
      }
      numAllocCols += parsers[ii].nCols;
      for (jj = 0; jj < parsers[4].nCols; jj++) iterCols[startCol++] = parsers[4].colData[jj];

    } else if (weight == DOUBLENULLVALUE) {
      int wtdatatype;

      /* It's a "regular" weighting column */
      fits_get_eqcoltype(fptr, wtcolnum, &wtdatatype, &wtrepeat, NULL, status);

      histData.startCols[4] = startCol;
      fits_iter_set_by_num(&(iterCols[startCol]), fptr, wtcolnum, TDOUBLE, InputCol);
      startCol ++;
    } else {

      /* In case of explicit numerical value, we can just use that number
	 in the vector expression, so the vector repeat of the weighting can
	 be set to that of the input */
      wtrepeat = repeat;
    }

    /* Vector dimension of weighting must agree with binning */
    if (wtrepeat != 0 && repeat != 0 && wtrepeat != repeat) {
      ffpmsg("vector dimensions of weights do not agree with bins");
      *status = BAD_DIMEN;
      goto cleanup;
    }

    /* We now know he number of iterator columns */
    numIterCols = startCol;

    /* Fill in iterator information for the parser*/
    histData.numIterCols = numIterCols;
    histData.iterCols = iterCols;
    histData.parsers = parsers;
    histData.infos = infos;
    histData.repeat = repeat;

    /* Set global variables with histogram parameter values.    */
    /* Use separate scalar variables rather than arrays because */
    /* it is more efficient when computing the histogram.       */

    histData.hcolnum[0]  = colnum[0];
    histData.amin1 = tmin[0];
    histData.maxbin1 = maxbin[0];
    histData.binsize1 = tbin[0];
    histData.haxis1 = (long) taxes[0];
    histData.incr[0] = 1;

    if (histData.haxis > 1)
    {
      histData.hcolnum[1]  = colnum[1];
      histData.amin2 = tmin[1];
      histData.maxbin2 = maxbin[1];
      histData.binsize2 = tbin[1];
      histData.haxis2 = (long) taxes[1];
      histData.incr[1] = histData.incr[0] * histData.haxis1;

      if (histData.haxis > 2)
      {
        histData.hcolnum[2]  = colnum[2];
        histData.amin3 = tmin[2];
        histData.maxbin3 = maxbin[2];
        histData.binsize3 = tbin[2];
        histData.haxis3 = (long) taxes[2];
	histData.incr[2] = histData.incr[1] * histData.haxis2;

        if (histData.haxis > 3)
        {
          histData.hcolnum[3]  = colnum[3];
          histData.amin4 = tmin[3];
          histData.maxbin4 = maxbin[3];
          histData.binsize4 = tbin[3];
          histData.haxis4 = (long) taxes[3];
	  histData.incr[3] = histData.incr[2] * histData.haxis3;
        }
      }
    }

    /* define parameters of image for the iterator function */
    fits_iter_set_file(imagepars, histptr);        /* pointer to image */
    fits_iter_set_datatype(imagepars, imagetype);  /* image datatype   */
    fits_iter_set_iotype(imagepars, OutputCol);    /* image is output  */

    /* call the iterator function to write out the histogram image */
    fits_iterate_data(n_cols, imagepars, offset, n_per_loop,
                          ffwritehisto, (void*)&histData, status);
       
 cleanup:
    /* Free any allocated memory ... */
    if (iterCols) free(iterCols);
    /* ... and parsers */
    for (ii = 0; ii <= 4; ii ++) {
      if (parsers[ii].nCols > 0) ffcprs(&(parsers[ii]));
    }
    return(*status);
}